

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# retinaface.cpp
# Opt level: O3

Mat * generate_anchors(Mat *__return_storage_ptr__,int base_size,Mat *ratios,Mat *scales)

{
  uint uVar1;
  uint uVar2;
  Mat *extraout_RAX;
  Mat *extraout_RAX_00;
  Mat *pMVar3;
  long lVar4;
  float *pfVar5;
  long lVar6;
  undefined4 in_register_00000034;
  ulong uVar7;
  ulong uVar8;
  float fVar9;
  float fVar10;
  float fVar11;
  float fVar12;
  
  uVar1 = *(uint *)((long)CONCAT44(in_register_00000034,base_size) + 0x2c);
  uVar2 = ratios->w;
  __return_storage_ptr__->cstep = 0;
  __return_storage_ptr__->data = (void *)0x0;
  __return_storage_ptr__->refcount = (int *)0x0;
  *(undefined8 *)((long)&__return_storage_ptr__->refcount + 4) = 0;
  *(undefined8 *)((long)&__return_storage_ptr__->elemsize + 4) = 0;
  __return_storage_ptr__->allocator = (Allocator *)0x0;
  __return_storage_ptr__->dims = 0;
  __return_storage_ptr__->w = 0;
  __return_storage_ptr__->w = 0;
  __return_storage_ptr__->h = 0;
  __return_storage_ptr__->d = 0;
  __return_storage_ptr__->c = 0;
  ncnn::Mat::create(__return_storage_ptr__,4,uVar2 * uVar1,4,(Allocator *)0x0);
  pMVar3 = extraout_RAX;
  if (0 < (int)uVar1) {
    lVar6 = 0;
    uVar8 = 0;
    do {
      pMVar3 = *(Mat **)CONCAT44(in_register_00000034,base_size);
      fVar10 = *(float *)((long)&pMVar3->data + uVar8 * 4);
      if (fVar10 < 0.0) {
        fVar9 = sqrtf(fVar10);
        pMVar3 = extraout_RAX_00;
      }
      else {
        fVar9 = SQRT(fVar10);
      }
      if (0 < (int)uVar2) {
        fVar9 = roundf(16.0 / fVar9);
        fVar10 = roundf(fVar10 * (float)(int)fVar9);
        pMVar3 = (Mat *)ratios->data;
        lVar4 = (long)__return_storage_ptr__->w * __return_storage_ptr__->elemsize;
        pfVar5 = (float *)(lVar4 * lVar6 + (long)__return_storage_ptr__->data);
        uVar7 = 0;
        do {
          fVar12 = *(float *)((long)&pMVar3->data + uVar7 * 4);
          fVar11 = fVar12 * (float)(int)fVar9;
          fVar12 = fVar12 * (float)(int)fVar10;
          *pfVar5 = -fVar11 * 0.5 + 8.0;
          pfVar5[1] = -fVar12 * 0.5 + 8.0;
          pfVar5[2] = fVar11 * 0.5 + 8.0;
          pfVar5[3] = fVar12 * 0.5 + 8.0;
          uVar7 = uVar7 + 1;
          pfVar5 = (float *)((long)pfVar5 + lVar4);
        } while (uVar2 != uVar7);
      }
      uVar8 = uVar8 + 1;
      lVar6 = lVar6 + (ulong)uVar2;
    } while (uVar8 != uVar1);
  }
  return pMVar3;
}

Assistant:

static ncnn::Mat generate_anchors(int base_size, const ncnn::Mat& ratios, const ncnn::Mat& scales)
{
    int num_ratio = ratios.w;
    int num_scale = scales.w;

    ncnn::Mat anchors;
    anchors.create(4, num_ratio * num_scale);

    const float cx = base_size * 0.5f;
    const float cy = base_size * 0.5f;

    for (int i = 0; i < num_ratio; i++)
    {
        float ar = ratios[i];

        int r_w = round(base_size / sqrt(ar));
        int r_h = round(r_w * ar); //round(base_size * sqrt(ar));

        for (int j = 0; j < num_scale; j++)
        {
            float scale = scales[j];

            float rs_w = r_w * scale;
            float rs_h = r_h * scale;

            float* anchor = anchors.row(i * num_scale + j);

            anchor[0] = cx - rs_w * 0.5f;
            anchor[1] = cy - rs_h * 0.5f;
            anchor[2] = cx + rs_w * 0.5f;
            anchor[3] = cy + rs_h * 0.5f;
        }
    }

    return anchors;
}